

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QGraphicsSceneEvent *event)

{
  ushort uVar1;
  Int t;
  Int IVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  QGraphicsSceneMouseEventPrivate *d;
  char *pcVar6;
  QDebug *pQVar7;
  long lVar8;
  long in_RDX;
  QFlags<Qt::KeyboardModifier> *extraout_RDX;
  QFlags<Qt::MouseButton> *value;
  QFlags<Qt::KeyboardModifier> *value_00;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_00;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_01;
  QFlags<Qt::KeyboardModifier> *value_01;
  QFlags<Qt::MouseButton> *value_02;
  QFlags<Qt::KeyboardModifier> *value_03;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_02;
  QFlags<Qt::KeyboardModifier> *extraout_RDX_03;
  QFlags<Qt::KeyboardModifier> *value_04;
  QGraphicsSceneContextMenuEvent *ce;
  long in_FS_OFFSET;
  QPointF QVar9;
  Stream *local_88;
  undefined1 local_80 [12];
  QFlagsStorage<Qt::MouseButton> local_74;
  QDebugStateSaver saver;
  undefined1 local_68 [8];
  char *pcStack_60;
  QDebugStateSaver saver_1;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)event);
  *(undefined1 *)(*(long *)event + 0x30) = 0;
  if (in_RDX == 0) {
    QDebug::operator<<((QDebug *)event,"QGraphicsSceneEvent(0)");
    goto switchD_005b4673_caseD_a3;
  }
  uVar1 = *(ushort *)(in_RDX + 8);
  switch(uVar1) {
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
    t = *(Int *)(*(long *)(in_RDX + 0x10) + 0x88);
    IVar2 = *(Int *)(*(long *)(in_RDX + 0x10) + 0x8c);
    local_74.i = IVar2;
    QDebug::operator<<((QDebug *)event,"QGraphicsSceneMouseEvent(");
    QMetaObject::indexOfEnumerator((char *)&QEvent::staticMetaObject);
    _local_68 = (QPointF)QMetaObject::enumerator(0x80daf8);
    pcVar6 = (char *)QMetaEnum::valueToKey((ulonglong)local_68);
    if (pcVar6 == (char *)0x0) {
      QDebug::operator<<((QDebug *)event,(uint)uVar1);
      value_04 = extraout_RDX_00;
    }
    else {
      QDebug::operator<<((QDebug *)event,pcVar6);
      value_04 = extraout_RDX;
    }
    if (uVar1 != 0x9b) {
      QDebug::operator<<((QDebug *)event,", ");
      QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
      QVar9 = (QPointF)QMetaObject::enumerator(0x80e350);
      _local_68 = QVar9;
      pcVar6 = (char *)QMetaEnum::valueToKey((ulonglong)local_68);
      if (pcVar6 == (char *)0x0) {
        QDebug::operator<<((QDebug *)event,t);
        value_04 = extraout_RDX_02;
      }
      else {
        QDebug::operator<<((QDebug *)event,pcVar6);
        value_04 = extraout_RDX_01;
      }
    }
    if (t != IVar2 && IVar2 != 0) {
      QDebug::operator<<((QDebug *)event,", buttons=");
      QtDebugUtils::formatQFlags<Qt::MouseButton>
                ((QDebug *)event,(QFlags<Qt::MouseButton> *)&local_74);
      value_04 = extraout_RDX_03;
    }
    local_68._0_4_ = *(int *)(*(long *)(in_RDX + 0x10) + 0x90);
    QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>((QDebug *)event,local_68,value_04);
    QDebug::operator<<((QDebug *)event,", pos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x20);
    pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x28);
    QtDebugUtils::formatQPoint<QPointF>((QDebug *)event,(QPointF *)local_68);
    QDebug::operator<<((QDebug *)event,", scenePos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x30);
    pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x38);
    QtDebugUtils::formatQPoint<QPointF>((QDebug *)event,(QPointF *)local_68);
    QDebug::operator<<((QDebug *)event,", screenPos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x40);
    QtDebugUtils::formatQPoint<QPoint>((QDebug *)event,(QPoint *)local_68);
    lVar8 = *(long *)(in_RDX + 0x10);
    iVar3 = *(int *)(lVar8 + 0x94);
    if (iVar3 != 0) {
      QDebug::operator<<((QDebug *)event,", ");
      QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
      _local_68 = (QPointF)QMetaObject::enumerator(0x80e350);
      pcVar6 = (char *)QMetaEnum::valueToKey((ulonglong)local_68);
      if (pcVar6 == (char *)0x0) {
        QDebug::operator<<((QDebug *)event,iVar3);
      }
      else {
        QDebug::operator<<((QDebug *)event,pcVar6);
      }
      lVar8 = *(long *)(in_RDX + 0x10);
    }
    if (*(int *)(lVar8 + 0x98) != 0) {
      QDebug::operator<<((QDebug *)event,", flags=");
      QMetaEnum::fromType<QFlags<Qt::MouseEventFlag>>();
      _saver_1 = &DAT_aaaaaaaaaaaaaaaa;
      QDebugStateSaver::QDebugStateSaver(&saver_1,(QDebug *)event);
      *(undefined1 *)(*(long *)event + 0x31) = 1;
      QMetaEnum::valueToKeys((ulonglong)local_68);
      QDebug::operator<<((QDebug *)event,(QByteArray *)local_68);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_68);
      QDebugStateSaver::~QDebugStateSaver(&saver_1);
    }
    goto LAB_005b4cc6;
  case 0x9f:
    pQVar7 = QDebug::operator<<((QDebug *)event,"QGraphicsSceneContextMenuEvent(reason=");
    QDebug::operator<<(pQVar7,*(int *)(*(long *)(in_RDX + 0x10) + 0x4c));
    local_68._0_4_ = *(int *)(*(long *)(in_RDX + 0x10) + 0x48);
    QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>((QDebug *)event,local_68,value_01);
    QDebug::operator<<((QDebug *)event,", pos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x20);
    pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x28);
    break;
  case 0xa0:
  case 0xa1:
  case 0xa2:
    QDebug::operator<<((QDebug *)event,"QGraphicsSceneHoverEvent(");
    QDebug::operator<<((QDebug *)event,", pos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x20);
    pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x28);
    break;
  default:
    goto switchD_005b4673_caseD_a3;
  case 0xa4:
  case 0xa5:
  case 0xa6:
  case 0xa7:
    QDebug::operator<<((QDebug *)event,"QGraphicsSceneDragDropEvent(proposedAction=");
    iVar3 = *(int *)(*(long *)(in_RDX + 0x10) + 0x54);
    QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
    _local_68 = (QPointF)QMetaObject::enumerator(0x80e350);
    pcVar6 = (char *)QMetaEnum::valueToKey((ulonglong)local_68);
    if (pcVar6 == (char *)0x0) {
      QDebug::operator<<((QDebug *)event,iVar3);
    }
    else {
      QDebug::operator<<((QDebug *)event,pcVar6);
    }
    QDebug::operator<<((QDebug *)event,", possibleActions=");
    QMetaEnum::fromType<QFlags<Qt::DropAction>>();
    _saver_1 = &DAT_aaaaaaaaaaaaaaaa;
    QDebugStateSaver::QDebugStateSaver(&saver_1,(QDebug *)event);
    *(undefined1 *)(*(long *)event + 0x31) = 1;
    QMetaEnum::valueToKeys((ulonglong)local_68);
    QDebug::operator<<((QDebug *)event,(QByteArray *)local_68);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_68);
    QDebugStateSaver::~QDebugStateSaver(&saver_1);
    pQVar7 = QDebug::operator<<((QDebug *)event,", source=");
    local_88 = pQVar7->stream;
    *(int *)(local_88 + 0x28) = *(int *)(local_88 + 0x28) + 1;
    operator<<((Stream *)local_80,(QWidget *)&local_88);
    QDebug::~QDebug((QDebug *)local_80);
    QDebug::~QDebug((QDebug *)&local_88);
    local_68._0_4_ = *(int *)(*(long *)(in_RDX + 0x10) + 0x48);
    QtDebugUtils::formatNonNullQFlags<Qt::MouseButton>((QDebug *)event,local_68,value);
    local_68._0_4_ = *(int *)(*(long *)(in_RDX + 0x10) + 0x4c);
    QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>((QDebug *)event,local_68,value_00);
    QDebug::operator<<((QDebug *)event,", pos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x20);
    pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x28);
    QtDebugUtils::formatQPoint<QPointF>((QDebug *)event,(QPointF *)local_68);
    QDebug::operator<<((QDebug *)event,", scenePos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x30);
    pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x38);
    QtDebugUtils::formatQPoint<QPointF>((QDebug *)event,(QPointF *)local_68);
    QDebug::operator<<((QDebug *)event,", screenPos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x40);
    QtDebugUtils::formatQPoint<QPoint>((QDebug *)event,(QPoint *)local_68);
    goto switchD_005b4673_caseD_a3;
  case 0xa8:
    QDebug::operator<<((QDebug *)event,"QGraphicsSceneWheelEvent(");
    local_68._0_4_ = *(int *)(*(long *)(in_RDX + 0x10) + 0x50);
    QtDebugUtils::formatNonNullQFlags<Qt::MouseButton>((QDebug *)event,local_68,value_02);
    local_68._0_4_ = *(int *)(*(long *)(in_RDX + 0x10) + 0x54);
    QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>((QDebug *)event,local_68,value_03);
    QDebug::operator<<((QDebug *)event,", pos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x20);
    pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x28);
    QtDebugUtils::formatQPoint<QPointF>((QDebug *)event,(QPointF *)local_68);
    QDebug::operator<<((QDebug *)event,", scenePos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x30);
    pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x38);
    QtDebugUtils::formatQPoint<QPointF>((QDebug *)event,(QPointF *)local_68);
    QDebug::operator<<((QDebug *)event,", screenPos=");
    local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x40);
    goto LAB_005b4ae9;
  }
  QtDebugUtils::formatQPoint<QPointF>((QDebug *)event,(QPointF *)local_68);
  QDebug::operator<<((QDebug *)event,", scenePos=");
  local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x30);
  pcStack_60 = *(char **)(*(long *)(in_RDX + 0x10) + 0x38);
  QtDebugUtils::formatQPoint<QPointF>((QDebug *)event,(QPointF *)local_68);
  QDebug::operator<<((QDebug *)event,", screenPos=");
  local_68 = *(undefined1 (*) [8])(*(long *)(in_RDX + 0x10) + 0x40);
LAB_005b4ae9:
  QtDebugUtils::formatQPoint<QPoint>((QDebug *)event,(QPoint *)local_68);
LAB_005b4cc6:
  QDebug::operator<<((QDebug *)event,')');
switchD_005b4673_caseD_a3:
  uVar5 = *(undefined8 *)event;
  *(undefined8 *)event = 0;
  *(undefined8 *)debug.stream = uVar5;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QGraphicsSceneEvent *event)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    if (!event) {
        debug << "QGraphicsSceneEvent(0)";
        return debug;
    }

    const QEvent::Type type = event->type();
    switch (type) {
    case QEvent::GraphicsSceneMouseMove:
    case QEvent::GraphicsSceneMousePress:
    case QEvent::GraphicsSceneMouseRelease:
    case QEvent::GraphicsSceneMouseDoubleClick: {
        const QGraphicsSceneMouseEvent *me = static_cast<const QGraphicsSceneMouseEvent *>(event);
        const Qt::MouseButton button = me->button();
        const Qt::MouseButtons buttons = me->buttons();
        debug << "QGraphicsSceneMouseEvent(";
        QtDebugUtils::formatQEnum(debug, type);
        if (type != QEvent::GraphicsSceneMouseMove) {
            debug << ", ";
            QtDebugUtils::formatQEnum(debug, button);
        }
        if (buttons && button != buttons) {
            debug << ", buttons=";
            QtDebugUtils::formatQFlags(debug, buttons);
        }
        QtDebugUtils::formatNonNullQFlags(debug, ", ", me->modifiers());
        formatPositions(debug, me);
        QtDebugUtils::formatNonNullQEnum(debug, ", ", me->source());
        QtDebugUtils::formatNonNullQFlags(debug, ", flags=", me->flags());
        debug << ')';
    }
        break;
    case QEvent::GraphicsSceneContextMenu: {
        const QGraphicsSceneContextMenuEvent *ce = static_cast<const QGraphicsSceneContextMenuEvent *>(event);
        debug << "QGraphicsSceneContextMenuEvent(reason=" << ce->reason();
        QtDebugUtils::formatNonNullQFlags(debug, ", ", ce->modifiers());
        formatPositions(debug, ce);
        debug << ')';
    }
        break;
    case QEvent::GraphicsSceneHoverEnter:
    case QEvent::GraphicsSceneHoverMove:
    case QEvent::GraphicsSceneHoverLeave:
        debug << "QGraphicsSceneHoverEvent(";
        formatPositions(debug, static_cast<const QGraphicsSceneHoverEvent *>(event));
        debug << ')';
        break;
    case QEvent::GraphicsSceneHelp:
        break;
    case QEvent::GraphicsSceneDragEnter:
    case QEvent::GraphicsSceneDragMove:
    case QEvent::GraphicsSceneDragLeave:
    case QEvent::GraphicsSceneDrop: {
        const QGraphicsSceneDragDropEvent *de = static_cast<const QGraphicsSceneDragDropEvent *>(event);
        debug << "QGraphicsSceneDragDropEvent(proposedAction=";
        QtDebugUtils::formatQEnum(debug, de->proposedAction());
        debug << ", possibleActions=";
        QtDebugUtils::formatQFlags(debug, de->possibleActions());
        debug << ", source=" << de->source();
        QtDebugUtils::formatNonNullQFlags(debug, ", buttons=", de->buttons());
        QtDebugUtils::formatNonNullQFlags(debug, ", ", de->modifiers());
        formatPositions(debug, de);
    }
        break;
    case QEvent::GraphicsSceneWheel: {
        const QGraphicsSceneWheelEvent *we = static_cast<const QGraphicsSceneWheelEvent *>(event);
        debug << "QGraphicsSceneWheelEvent(";
        QtDebugUtils::formatNonNullQFlags(debug, ", buttons=", we->buttons());
        QtDebugUtils::formatNonNullQFlags(debug, ", ", we->modifiers());
        formatPositions(debug, we);
        debug << ')';
    }
        break;
    default:
        break;
    }
    return debug;
}